

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O0

KBOOL __thiscall KDIS::PDU::Data_Query_PDU::operator==(Data_Query_PDU *this,Data_Query_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Data_Query_PDU *Value_local;
  Data_Query_PDU *this_local;
  
  KVar1 = Simulation_Management_Header::operator!=
                    (&this->super_Simulation_Management_Header,
                     &Value->super_Simulation_Management_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::TimeStamp::operator!=(&this->m_TimeInterval,&Value->m_TimeInterval);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else if (this->m_ui32NumFixedDatum == Value->m_ui32NumFixedDatum) {
      if (this->m_ui32NumVariableDatum == Value->m_ui32NumVariableDatum) {
        bVar2 = std::operator!=(&this->m_vFixedDatum,&Value->m_vFixedDatum);
        if (bVar2) {
          this_local._7_1_ = false;
        }
        else {
          bVar2 = std::operator!=(&this->m_vVariableDatum,&Value->m_vVariableDatum);
          if (bVar2) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Data_Query_PDU::operator == ( const Data_Query_PDU & Value ) const
{
    if( Simulation_Management_Header::operator !=( Value ) )     return false;
    if( m_TimeInterval         != Value.m_TimeInterval )         return false;
    if( m_ui32NumFixedDatum    != Value.m_ui32NumFixedDatum )    return false;
    if( m_ui32NumVariableDatum != Value.m_ui32NumVariableDatum ) return false;
    if( m_vFixedDatum          != Value.m_vFixedDatum )          return false;
    if( m_vVariableDatum       != Value.m_vVariableDatum )       return false;
    return true;
}